

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarseparator.cpp
# Opt level: O0

void __thiscall QToolBarSeparator::paintEvent(QToolBarSeparator *this,QPaintEvent *param_2)

{
  QStyle *pQVar1;
  QWidget *pQVar2;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QPainter p;
  QStyleOption opt;
  QStyleOption *in_stack_ffffffffffffff78;
  undefined1 **ppuVar3;
  QStyleOption *this_00;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QPalettePrivate *local_28;
  undefined1 *puStack_20;
  QObject *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QStyleOption *)&local_50;
  QPainter::QPainter((QPainter *)this_00,(QPaintDevice *)&in_RDI->rect);
  local_18 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  ppuVar3 = &local_48;
  QStyleOption::QStyleOption(this_00,(int)((ulong)ppuVar3 >> 0x20),(int)ppuVar3);
  initStyleOption((QToolBarSeparator *)in_RDI,in_stack_ffffffffffffff78);
  pQVar1 = QWidget::style((QWidget *)in_stack_ffffffffffffff78);
  pQVar2 = QWidget::parentWidget((QWidget *)0x701e4b);
  (**(code **)(*(long *)pQVar1 + 0xb0))(pQVar1,0x25,ppuVar3,this_00,pQVar2);
  QStyleOption::~QStyleOption(in_RDI);
  QPainter::~QPainter((QPainter *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarSeparator::paintEvent(QPaintEvent *)
{
    QPainter p(this);
    QStyleOption opt;
    initStyleOption(&opt);
    style()->drawPrimitive(QStyle::PE_IndicatorToolBarSeparator, &opt, &p, parentWidget());
}